

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# syntax.h
# Opt level: O1

void Parse_Block(KonohaContext *kctx,KonohaStack *sfp)

{
  kNode *node;
  kArray *tokenList;
  kint_t kVar1;
  kint_t kVar2;
  int iVar3;
  
  node = sfp[1].field_0.asNode;
  tokenList = sfp[3].field_0.asArray;
  kVar1 = sfp[4].field_1.intValue;
  iVar3 = *(int *)&sfp[5].field_1;
  kVar2 = sfp[6].field_1.intValue;
  (*(kctx->platApi->ConsoleModule).ReportDebugMessage)
            ("/workspace/llm4binary/github/license_all_cmakelists_1510/konoha-project[P]konoha3/src/parser/import/syntax.h"
             ,"Parse_Block",0x58,"tracing..");
  if (iVar3 != -1) {
    iVar3 = (int)kVar2;
    AppendParsedNode(kctx,node,tokenList,(int)kVar1,iVar3,IsStatementEnd,ParseMetaPatternOption,
                     (char *)0x0);
    sfp[-4].field_1 = (anon_union_8_10_3f923e25_for_KonohaValueVar_2)(long)iVar3;
  }
  return;
}

Assistant:

static KMETHOD Parse_Block(KonohaContext *kctx, KonohaStack *sfp)
{
	VAR_Parse(block, name, tokenList, beginIdx, opIdx, endIdx);
	if(opIdx != -1) {
		AppendParsedNode(kctx, block, tokenList, beginIdx, endIdx, IsStatementEnd, ParseMetaPatternOption, NULL);
		KReturnUnboxValue(endIdx);
	}
}